

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::Scope(Scope<hgdb::json::VarStmt> *this,uint32_t line)

{
  (this->super_ScopeBase).scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ScopeBase).scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ScopeBase).parent = (ScopeBase *)0x0;
  (this->super_ScopeBase).scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ScopeBase).index_ = 0;
  (this->super_ScopeBase)._vptr_ScopeBase = (_func_int **)&PTR_serialize_002a96e0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = line;
  (this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = true;
  this->column_num = 0;
  (this->condition)._M_dataplus._M_p = (pointer)&(this->condition).field_2;
  (this->condition)._M_string_length = 0;
  (this->condition).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Scope(uint32_t line) : line_num(line) {}